

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O0

void dumpData<int>(Serializer *serializer,DataFieldInfo *info,Savepoint *savepoint,Bounds *iBounds,
                  Bounds *jBounds,Bounds *kBounds,Bounds *lBounds)

{
  int *piVar1;
  int local_a0;
  int index;
  int l;
  int k;
  int j;
  int i;
  int local_88;
  int lUpper;
  int local_80;
  int lLower;
  int lSize;
  int local_74;
  int kUpper;
  int local_6c;
  int kLower;
  int kSize;
  int local_60;
  int jUpper;
  int local_58;
  int jLower;
  int jSize;
  int local_4c;
  int iUpper;
  int local_44;
  int iLower;
  int iSize;
  int *data;
  Bounds *kBounds_local;
  Bounds *jBounds_local;
  Bounds *iBounds_local;
  Savepoint *savepoint_local;
  DataFieldInfo *info_local;
  Serializer *serializer_local;
  
  data = &kBounds->lower;
  kBounds_local = jBounds;
  jBounds_local = iBounds;
  iBounds_local = (Bounds *)savepoint;
  savepoint_local = (Savepoint *)info;
  info_local = (DataFieldInfo *)serializer;
  readData<int>(serializer,info,savepoint,(int **)&iLower);
  local_44 = ser::DataFieldInfo::iSize((DataFieldInfo *)savepoint_local);
  local_4c = 0;
  piVar1 = std::max<int>(&local_4c,&jBounds_local->lower);
  iUpper = *piVar1;
  jLower = local_44 + -1;
  piVar1 = std::min<int>(&jLower,&jBounds_local->upper);
  jSize = *piVar1;
  local_58 = ser::DataFieldInfo::jSize((DataFieldInfo *)savepoint_local);
  local_60 = 0;
  piVar1 = std::max<int>(&local_60,&kBounds_local->lower);
  jUpper = *piVar1;
  kLower = local_58 + -1;
  piVar1 = std::min<int>(&kLower,&kBounds_local->upper);
  kSize = *piVar1;
  local_6c = ser::DataFieldInfo::kSize((DataFieldInfo *)savepoint_local);
  local_74 = 0;
  piVar1 = std::max<int>(&local_74,data);
  kUpper = *piVar1;
  lLower = local_6c + -1;
  piVar1 = std::min<int>(&lLower,data + 1);
  lSize = *piVar1;
  local_80 = ser::DataFieldInfo::lSize((DataFieldInfo *)savepoint_local);
  local_88 = 0;
  piVar1 = std::max<int>(&local_88,&lBounds->lower);
  lUpper = *piVar1;
  j = local_80 + -1;
  piVar1 = std::min<int>(&j,&lBounds->upper);
  i = *piVar1;
  for (k = iUpper; k <= jSize; k = k + 1) {
    for (l = jUpper; l <= kSize; l = l + 1) {
      if (1 < local_6c) {
        std::operator<<((ostream *)&std::cout,"[ ");
      }
      for (index = kUpper; index <= lSize; index = index + 1) {
        if (1 < local_80) {
          std::operator<<((ostream *)&std::cout,"( ");
        }
        for (local_a0 = lUpper; local_a0 <= i; local_a0 = local_a0 + 1) {
          std::ostream::operator<<
                    (&std::cout,
                     _iLower[k * local_58 * local_6c * local_80 + l * local_6c * local_80 +
                             index * local_80 + local_a0]);
          if (local_a0 < i) {
            std::operator<<((ostream *)&std::cout,", ");
          }
        }
        if (1 < local_80) {
          std::operator<<((ostream *)&std::cout," )");
        }
        if (index < lSize) {
          std::operator<<((ostream *)&std::cout,", ");
        }
      }
      if (1 < local_6c) {
        std::operator<<((ostream *)&std::cout," ]");
      }
      if (l < kSize) {
        std::operator<<((ostream *)&std::cout,", ");
      }
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void dumpData(const Serializer& serializer, const DataFieldInfo& info, const Savepoint& savepoint,
              const Bounds& iBounds, const Bounds& jBounds, const Bounds& kBounds, const Bounds& lBounds)
{
	T* data;
	readData(serializer, info, savepoint, data);

	int iSize = info.iSize();
	int iLower = std::max(0, iBounds.lower);
	int iUpper = std::min(iSize - 1, iBounds.upper);
	int jSize = info.jSize();
	int jLower = std::max(0, jBounds.lower);
	int jUpper = std::min(jSize - 1, jBounds.upper);
	int kSize = info.kSize();
	int kLower = std::max(0, kBounds.lower);
	int kUpper = std::min(kSize - 1, kBounds.upper);
	int lSize = info.lSize();
	int lLower = std::max(0, lBounds.lower);
	int lUpper = std::min(lSize - 1, lBounds.upper);

	for (int i = iLower; i <= iUpper; ++i)
	{
		for (int j = jLower; j <= jUpper; ++j)
		{
			if (kSize > 1) std::cout << "[ ";
			for (int k = kLower; k <= kUpper; ++k)
			{
				if (lSize > 1) std::cout << "( ";
				for (int l = lLower; l <= lUpper; ++l)
				{
					int index = i * jSize * kSize * lSize + j * kSize * lSize + k * lSize + l;
					std::cout << data[index];
					if (l < lUpper) std::cout << ", ";
				}
				if (lSize > 1) std::cout << " )";
				if (k < kUpper) std::cout << ", ";
			}
			if (kSize > 1) std::cout << " ]";
			if (j < jUpper) std::cout << ", ";
		}
		std::cout << std::endl;
	}
}